

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O0

Strategy boost::deflate::deflate_stream_test::toStrategy(int strategy)

{
  Strategy local_c;
  int strategy_local;
  
  switch(strategy) {
  default:
    local_c = normal;
    break;
  case 1:
    local_c = filtered;
    break;
  case 2:
    local_c = huffman;
    break;
  case 3:
    local_c = rle;
    break;
  case 4:
    local_c = fixed;
  }
  return local_c;
}

Assistant:

static
    Strategy toStrategy(int strategy)
    {
        switch(strategy)
        {
        default:
        case 0: return Strategy::normal;
        case 1: return Strategy::filtered;
        case 2: return Strategy::huffman;
        case 3: return Strategy::rle;
        case 4: return Strategy::fixed;
        }
    }